

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

uint64_t hash_file_contents(io_buf *io,int f)

{
  int iVar1;
  int extraout_var;
  ssize_t i;
  long lVar3;
  uint64_t uVar4;
  uchar buf [1024];
  byte local_428 [1032];
  long lVar2;
  
  uVar4 = 0x4967a1cbaca3d988;
  do {
    iVar1 = (*io->_vptr_io_buf[5])(io,f,local_428);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (lVar2 != 0 && -1 < extraout_var) {
      lVar3 = 0;
      do {
        uVar4 = (ulong)local_428[lVar3] + uVar4 * 0x145f4971;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
  } while (lVar2 != 0 && -1 < extraout_var);
  return uVar4;
}

Assistant:

uint64_t hash_file_contents(io_buf* io, int f)
{
  uint64_t v = 5289374183516789128;
  unsigned char buf[1024];
  while (true)
  {
    ssize_t n = io->read_file(f, buf, 1024);
    if (n <= 0)
      break;
    for (ssize_t i = 0; i < n; i++)
    {
      v *= 341789041;
      v += buf[i];
    }
  }
  return v;
}